

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O1

Vec_Int_t * Gia_ManIffSelect(Iff_Man_t *p)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Man_t *pGVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  
  iVar1 = p->pGia->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar5 << 2);
  }
  p_00->pArray = piVar3;
  Vec_IntPush(p_00,0);
  Gia_ManIncrementTravId(p->pGia);
  pGVar4 = p->pGia;
  if (pGVar4->nTravIdsAlloc < 1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  piVar3 = pGVar4->pTravIds;
  *piVar3 = pGVar4->nTravIds;
  pVVar6 = pGVar4->vCis;
  if (0 < pVVar6->nSize) {
    piVar2 = pVVar6->pArray;
    lVar7 = 0;
    do {
      iVar1 = piVar2[lVar7];
      if (((long)iVar1 < 0) || (pGVar4->nObjs <= iVar1)) goto LAB_00745fd3;
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      if (pGVar4->nTravIdsAlloc <= iVar1) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      piVar3[iVar1] = pGVar4->nTravIds;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar6->nSize);
  }
  pGVar4 = p->pGia;
  pVVar6 = pGVar4->vCos;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      iVar1 = pVVar6->pArray[lVar7];
      if (((long)iVar1 < 0) || (pGVar4->nObjs <= iVar1)) {
LAB_00745fd3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      Gia_ManIffSelect_rec(p,iVar1 - (*(uint *)(pGVar4->pObjs + iVar1) & 0x1fffffff),p_00);
      lVar7 = lVar7 + 1;
      pGVar4 = p->pGia;
      pVVar6 = pGVar4->vCos;
    } while (lVar7 < pVVar6->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManIffSelect( Iff_Man_t * p )
{
    Vec_Int_t * vPacking;
    Gia_Obj_t * pObj; int i;
    vPacking = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );
    Vec_IntPush( vPacking, 0 );
    // mark const0 and PIs
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrentId( p->pGia, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pObj );
    // recursively collect internal nodes
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ManIffSelect_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), vPacking );
    return vPacking;
}